

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa_milo.h
# Opt level: O0

DiyFp __thiscall DiyFp::NormalizeBoundary(DiyFp *this)

{
  DiyFp DVar1;
  DiyFp *this_local;
  DiyFp res;
  
  this_local = (DiyFp *)this->f;
  res.f._0_4_ = (int)*(undefined8 *)&this->e;
  for (; ((ulong)this_local & 0x20000000000000) == 0; this_local = (DiyFp *)((long)this_local << 1))
  {
    res.f._0_4_ = (int)res.f + -1;
  }
  DVar1.f = (long)this_local << 10;
  DVar1.e = (int)res.f + -10;
  DVar1._12_4_ = 0;
  return DVar1;
}

Assistant:

DiyFp NormalizeBoundary() const {
#if defined(_MSC_VER) && defined(_M_AMD64)
		unsigned long index;
		_BitScanReverse64(&index, f);
		return DiyFp (f << (63 - int(index)), e - (63 - int(index)));
#else
		DiyFp res = *this;
		while (!(res.f & (kDpHiddenBit << 1))) {
			res.f <<= 1;
			res.e--;
		}
		res.f <<= (kDiySignificandSize - kDpSignificandSize - 2);
		res.e = res.e - (kDiySignificandSize - kDpSignificandSize - 2);
		return res;
#endif
	}